

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O3

void __thiscall BinHash<TldAddressAsKey>::Clear(BinHash<TldAddressAsKey> *this)

{
  TldAddressAsKey *x;
  TldAddressAsKey *pTVar1;
  uint uVar2;
  TldAddressAsKey **ppTVar3;
  TldAddressAsKey **ppTVar4;
  ulong uVar5;
  
  ppTVar4 = this->hashBin;
  if (ppTVar4 != (TldAddressAsKey **)0x0) {
    uVar2 = this->tableSize;
    if (uVar2 != 0) {
      uVar5 = 0;
      do {
        pTVar1 = ppTVar4[uVar5];
        if (pTVar1 != (TldAddressAsKey *)0x0) {
          ppTVar3 = ppTVar4 + uVar5;
          do {
            *ppTVar3 = pTVar1->HashNext;
            operator_delete(pTVar1);
            ppTVar4 = this->hashBin;
            ppTVar3 = ppTVar4 + uVar5;
            pTVar1 = *ppTVar3;
          } while (pTVar1 != (TldAddressAsKey *)0x0);
          uVar2 = this->tableSize;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar2);
    }
    operator_delete__(ppTVar4);
    this->hashBin = (TldAddressAsKey **)0x0;
  }
  this->tableSize = 0;
  this->tableCount = 0;
  return;
}

Assistant:

void Clear()
    {
        if (hashBin != NULL)
        {
            for (uint32_t i = 0; i < tableSize; i++)
            {
                while (hashBin[i] != NULL)
                {
                    KeyObj *x = hashBin[i];
                    hashBin[i] = x->HashNext;
                    delete x;
                }
            }

            delete[] hashBin;
            hashBin = NULL;
        }

        tableCount = 0;
        tableSize = 0;
    }